

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program_builder.cpp
# Opt level: O0

bool __thiscall Clasp::ProgramBuilder::parseProgram(ProgramBuilder *this,istream *input)

{
  bool bVar1;
  uint uVar2;
  ProgramParser *this_00;
  socklen_t *in_RCX;
  ProgramParser *in_RSI;
  ProgramBuilder *in_RDI;
  ProgramParser *p;
  ProgramBuilder *in_stack_ffffffffffffffd0;
  undefined1 local_19 [9];
  ProgramParser *local_10;
  
  if (in_RDI->ctx_ != (SharedContext *)0x0) {
    local_10 = in_RSI;
    bVar1 = frozen(in_RDI);
    if (!bVar1) {
      this_00 = parser(in_stack_ffffffffffffffd0);
      local_19._1_8_ = this_00;
      ParserOptions::ParserOptions((ParserOptions *)local_19);
      uVar2 = ProgramParser::accept(this_00,(int)local_10,(sockaddr *)local_19,in_RCX);
      if ((uVar2 & 1) == 0) {
        Potassco::fail(-2,"bool Clasp::ProgramBuilder::parseProgram(std::istream &)",0x51,
                       "p.accept(input)","unrecognized input format",0);
      }
      bVar1 = ProgramParser::parse(local_10);
      return bVar1;
    }
  }
  Potassco::fail(-2,"bool Clasp::ProgramBuilder::parseProgram(std::istream &)",0x4f,
                 "ctx_ && !frozen()",(char *)0x0);
}

Assistant:

bool ProgramBuilder::parseProgram(std::istream& input) {
	POTASSCO_REQUIRE(ctx_ && !frozen());
	ProgramParser& p = parser();
	POTASSCO_REQUIRE(p.accept(input), "unrecognized input format");
	return p.parse();
}